

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O3

void __thiscall
tst_deprecations_helpers_qpromiseall::preserveOrder(tst_deprecations_helpers_qpromiseall *this)

{
  long *plVar1;
  QSharedData *pQVar2;
  int *piVar3;
  PromiseData<int> *pPVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar5;
  bool bVar6;
  char cVar7;
  QPromise<int> *data;
  char *pcVar8;
  char *pcVar9;
  const_iterator expectedBegin;
  ulong uVar10;
  long lVar11;
  anon_class_4_1_898ef5c2 handler;
  QList<int> local_b8;
  PromiseData<int> *local_a0;
  undefined **local_98;
  PromiseData<int> *local_90;
  QArrayData *d;
  QPromise<int> *pQStack_80;
  long local_78;
  QPromise<int> p2;
  QPromise<int> p1;
  QPromise<int> p0;
  QPromise<QList<int>_> p;
  QArrayData *d_1;
  
  d = (QArrayData *)CONCAT44(d._4_4_,0x2a);
  QtPromise::resolve<int>((QtPromise *)&local_b8,(int *)&d);
  handler.msec = (int)&local_b8;
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p0.super_QPromiseBase<int>,handler);
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0012d950;
  if ((long *)local_b8.d.ptr != (long *)0x0) {
    LOCK();
    plVar1 = (long *)((long)local_b8.d.ptr + 8);
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if (((int)*plVar1 == 0) && ((long *)local_b8.d.ptr != (long *)0x0)) {
      (**(code **)(*(long *)local_b8.d.ptr + 8))();
    }
  }
  d = (QArrayData *)CONCAT44(d._4_4_,0x2b);
  QtPromise::resolve<int>((QtPromise *)&local_b8,(int *)&d);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p1.super_QPromiseBase<int>,handler);
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0012d950;
  if ((long *)local_b8.d.ptr != (long *)0x0) {
    LOCK();
    plVar1 = (long *)((long)local_b8.d.ptr + 8);
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if (((int)*plVar1 == 0) && ((long *)local_b8.d.ptr != (long *)0x0)) {
      (**(code **)(*(long *)local_b8.d.ptr + 8))();
    }
  }
  d = (QArrayData *)CONCAT44(d._4_4_,0x2c);
  QtPromise::resolve<int>((QtPromise *)&local_b8,(int *)&d);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p2.super_QPromiseBase<int>,handler);
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0012d950;
  if ((long *)local_b8.d.ptr != (long *)0x0) {
    LOCK();
    plVar1 = (long *)((long)local_b8.d.ptr + 8);
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if (((int)*plVar1 == 0) && ((long *)local_b8.d.ptr != (long *)0x0)) {
      (**(code **)(*(long *)local_b8.d.ptr + 8))();
    }
  }
  local_b8.d.ptr = (int *)p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.d.d = (Data *)&PTR__QPromiseBase_0012dbb8;
  local_a0 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.d.size = (qsizetype)&PTR__QPromiseBase_0012dbb8;
  local_90 = p2.super_QPromiseBase<int>.m_d.d;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98 = &PTR__QPromiseBase_0012dbb8;
  pQStack_80 = (QPromise<int> *)QArrayData::allocate(&d,0x10,8,3,KeepSize);
  local_78 = 0;
  uVar10 = 0xfffffffffffffff0;
  do {
    pQStack_80[local_78].super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_0012d950;
    pPVar4 = *(PromiseData<int> **)((long)&local_a0 + uVar10);
    pQStack_80[local_78].super_QPromiseBase<int>.m_d.d = pPVar4;
    if (pPVar4 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar2 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQStack_80[local_78].super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_0012dbb8;
    local_78 = local_78 + 1;
    uVar10 = uVar10 + 0x10;
  } while (uVar10 < 0x20);
  QtPromise::all<int,_QList>((QtPromise *)&p,(QList<QtPromise::QPromise<int>_> *)&d);
  QArrayDataPointer<QtPromise::QPromise<int>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<int>_> *)&d);
  lVar11 = 0x30;
  do {
    *(undefined ***)(&stack0xffffffffffffff38 + lVar11) = &PTR__QPromiseBase_0012d950;
    if (*(long *)(&stack0xffffffffffffff40 + lVar11) != 0) {
      LOCK();
      piVar3 = (int *)(*(long *)(&stack0xffffffffffffff40 + lVar11) + 8);
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if ((*piVar3 == 0) && (*(long **)(&stack0xffffffffffffff40 + lVar11) != (long *)0x0)) {
        (**(code **)(**(long **)(&stack0xffffffffffffff40 + lVar11) + 8))();
      }
    }
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != 0);
  bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar6);
  d = (QArrayData *)CONCAT71(d._1_7_,1);
  pcVar8 = QTest::toString<bool>((bool *)&local_b8);
  pcVar9 = QTest::toString<bool>((bool *)&d);
  cVar7 = QTest::compare_helper
                    (bVar6,"Compared values are not the same",pcVar8,pcVar9,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0xbf);
  if (cVar7 != '\0') {
    bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar6);
    d = (QArrayData *)CONCAT71(d._1_7_,1);
    pcVar8 = QTest::toString<bool>((bool *)&local_b8);
    pcVar9 = QTest::toString<bool>((bool *)&d);
    cVar7 = QTest::compare_helper
                      (bVar6,"Compared values are not the same",pcVar8,pcVar9,"p1.isPending()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0xc0);
    if (cVar7 != '\0') {
      bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        (&(p2.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar6);
      d = (QArrayData *)CONCAT71(d._1_7_,1);
      pcVar8 = QTest::toString<bool>((bool *)&local_b8);
      pcVar9 = QTest::toString<bool>((bool *)&d);
      cVar7 = QTest::compare_helper
                        (bVar6,"Compared values are not the same",pcVar8,pcVar9,"p2.isPending()",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0xc1);
      if (cVar7 != '\0') {
        bVar6 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                          (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                            super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
        local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar6);
        d = (QArrayData *)CONCAT71(d._1_7_,1);
        pcVar8 = QTest::toString<bool>((bool *)&local_b8);
        pcVar9 = QTest::toString<bool>((bool *)&d);
        cVar7 = QTest::compare_helper
                          (bVar6,"Compared values are not the same",pcVar8,pcVar9,"p.isPending()",
                           "true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0xc2);
        if (cVar7 != '\0') {
          d = (QArrayData *)0x0;
          pQStack_80 = (QPromise<int> *)0x0;
          local_78 = 0;
          waitForValue<QList<int>>(&local_b8,&p,(QList<int> *)&d);
          expectedBegin.i = (int *)QArrayData::allocate(&d_1,4,8,3,KeepSize);
          expectedBegin.i[0] = 0x2a;
          expectedBegin.i[1] = 0x2b;
          expectedBegin.i[2] = 0x2c;
          bVar6 = QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                            ((const_iterator)local_b8.d.ptr,
                             (const_iterator)(local_b8.d.ptr + local_b8.d.size),expectedBegin,
                             (const_iterator)(expectedBegin.i + 3),"waitForValue(p, QVector<int>{})"
                             ,"(QVector<int>{42, 43, 44})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                             ,0xc3);
          if (d_1 != (QArrayData *)0x0) {
            LOCK();
            (d_1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (d_1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((d_1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(d_1,4,8);
            }
          }
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,4,8);
            }
          }
          if (d != (QArrayData *)0x0) {
            LOCK();
            (d->ref_)._q_value.super___atomic_base<int>._M_i =
                 (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(d,4,8);
            }
          }
          QVar5.d = p0.super_QPromiseBase<int>.m_d.d;
          if (bVar6) {
            bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                              (&(p0.super_QPromiseBase<int>.m_d.d)->
                                super_PromiseDataBase<int,_void_(const_int_&)>);
            bVar6 = (bool)(~bVar6 & ((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                                    m_error.m_data._M_exception_object == (void *)0x0);
            local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,bVar6);
            d = (QArrayData *)CONCAT71(d._1_7_,1);
            pcVar8 = QTest::toString<bool>((bool *)&local_b8);
            pcVar9 = QTest::toString<bool>((bool *)&d);
            cVar7 = QTest::compare_helper
                              (bVar6,"Compared values are not the same",pcVar8,pcVar9,
                               "p0.isFulfilled()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                               ,0xc4);
            QVar5 = p1.super_QPromiseBase<int>.m_d;
            if (cVar7 != '\0') {
              bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                                (&(p1.super_QPromiseBase<int>.m_d.d)->
                                  super_PromiseDataBase<int,_void_(const_int_&)>);
              local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,
                                              ~bVar6 & ((QVar5.d)->
                                                                                                              
                                                  super_PromiseDataBase<int,_void_(const_int_&)>).
                                                  m_error.m_data._M_exception_object == (void *)0x0)
              ;
              d = (QArrayData *)CONCAT71(d._1_7_,1);
              bVar6 = QTest::qCompare<bool,bool>
                                ((bool *)&local_b8,(bool *)&d,"p1.isFulfilled()","true",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                 ,0xc5);
              QVar5 = p2.super_QPromiseBase<int>.m_d;
              if (bVar6) {
                bVar6 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                                  (&(p2.super_QPromiseBase<int>.m_d.d)->
                                    super_PromiseDataBase<int,_void_(const_int_&)>);
                local_b8.d.d = (Data *)CONCAT71(local_b8.d.d._1_7_,
                                                ~bVar6 & ((QVar5.d)->
                                                                                                                  
                                                  super_PromiseDataBase<int,_void_(const_int_&)>).
                                                  m_error.m_data._M_exception_object == (void *)0x0)
                ;
                d = (QArrayData *)CONCAT71(d._1_7_,1);
                QTest::qCompare<bool,bool>
                          ((bool *)&local_b8,(bool *)&d,"p2.isFulfilled()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0xc6);
              }
            }
          }
        }
      }
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d8f0;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d950;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d950;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d950;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::preserveOrder()
{
    auto p0 = QtPromise::resolve(42).delay(500);
    auto p1 = QtPromise::resolve(43).delay(100);
    auto p2 = QtPromise::resolve(44).delay(250);

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p1, p2});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isPending(), true);
    QCOMPARE(p1.isPending(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isFulfilled(), true);
}